

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# segment.c
# Opt level: O2

mi_page_t * mi_segment_span_allocate(mi_segment_t *segment,size_t slice_index,size_t slice_count)

{
  mi_commit_mask_t *commit;
  size_t *psVar1;
  size_t *psVar2;
  ulong uVar3;
  long lVar4;
  size_t size;
  _Bool _Var5;
  size_t amount;
  mi_msecs_t mVar6;
  long lVar7;
  ulong uVar8;
  mi_page_t *pmVar9;
  long lVar10;
  ptrdiff_t idx;
  ulong uVar11;
  _Bool is_zero;
  size_t local_e0;
  mi_page_t *local_d8;
  size_t local_d0;
  mi_slice_t *local_c8;
  uint8_t *start;
  size_t full_size;
  mi_commit_mask_t mask;
  mi_commit_mask_t local_70;
  
  local_c8 = segment->slices;
  lVar10 = slice_index * 0x60;
  local_e0 = slice_count << 0x10;
  commit = &segment->commit_mask;
  lVar7 = 0xf;
  do {
    local_d8 = segment->slices + slice_index;
    local_d0 = slice_count;
    if (lVar7 == 0x17) {
      _Var5 = mi_commit_mask_is_empty(&segment->purge_mask);
      if (_Var5) goto LAB_004991a9;
      break;
    }
    lVar4 = lVar7 + -7;
    lVar7 = lVar7 + 1;
  } while ((segment->purge_mask).mask[lVar4] == 0xffffffffffffffff);
  start = (uint8_t *)0x0;
  full_size = 0;
  mi_segment_commit_mask
            (segment,false,(uint8_t *)(slice_index * 0x10000 + (long)segment),local_e0,&start,
             &full_size,&mask);
  _Var5 = mi_commit_mask_is_empty(&mask);
  size = full_size;
  if (full_size != 0 && !_Var5) {
    lVar7 = 0;
    do {
      if (lVar7 == 8) goto LAB_00499166;
      psVar2 = commit->mask + lVar7;
      psVar1 = mask.mask + lVar7;
      lVar7 = lVar7 + 1;
    } while ((*psVar1 & ~*psVar2) == 0);
    is_zero = false;
    mi_commit_mask_create_intersect(commit,&mask,&local_70);
    amount = _mi_commit_mask_committed_size(&local_70,0x2000000);
    _mi_stat_decrease(&_mi_stats_main.committed,amount);
    _Var5 = _mi_os_commit(start,size,&is_zero);
    if (!_Var5) {
      return (mi_page_t *)0x0;
    }
    mi_commit_mask_set(commit,&mask);
LAB_00499166:
    _Var5 = mi_commit_mask_any_set(&segment->purge_mask,&mask);
    if (_Var5) {
      mVar6 = _mi_clock_now();
      lVar7 = mi_option_get(mi_option_purge_delay);
      segment->purge_expire = lVar7 + mVar6;
    }
    mi_commit_mask_clear(&segment->purge_mask,&mask);
  }
LAB_004991a9:
  local_d8->slice_offset = 0;
  local_d8->slice_count = (uint32_t)local_d0;
  uVar8 = 0xff;
  if (local_d0 - 1 < 0xff) {
    uVar8 = local_d0 - 1;
  }
  local_d8->block_size = local_e0;
  uVar3 = segment->slice_entries;
  uVar11 = ~slice_index + uVar3;
  if (uVar8 + slice_index < uVar3) {
    uVar11 = uVar8;
  }
  lVar7 = 0x180;
  for (uVar8 = 1; uVar8 <= uVar11; uVar8 = uVar8 + 1) {
    *(int *)((long)&segment->purge_mask + lVar7 + lVar10 + -0x34) = (int)lVar7 + -0x120;
    *(undefined4 *)((long)&segment->purge_mask + lVar7 + lVar10 + -0x38) = 0;
    *(undefined8 *)((long)&segment->purge_mask + lVar7 + lVar10 + -0x10) = 1;
    lVar7 = lVar7 + 0x60;
  }
  pmVar9 = local_c8 + uVar3;
  if (local_d8 + (local_d0 - 1) <= local_c8 + uVar3) {
    pmVar9 = local_d8 + (local_d0 - 1);
  }
  if (local_d8 < pmVar9) {
    pmVar9->slice_offset = (int)pmVar9 - (int)local_d8;
    pmVar9->slice_count = 0;
    pmVar9->block_size = 1;
  }
  local_d8->field_0x8 = (local_d8->field_0x8 & 0xfa | (segment->kind == MI_SEGMENT_HUGE) << 2) + 1;
  segment->used = segment->used + 1;
  return local_d8;
}

Assistant:

static mi_page_t* mi_segment_span_allocate(mi_segment_t* segment, size_t slice_index, size_t slice_count) {
  mi_assert_internal(slice_index < segment->slice_entries);
  mi_slice_t* const slice = &segment->slices[slice_index];
  mi_assert_internal(slice->block_size==0 || slice->block_size==1);

  // commit before changing the slice data
  if (!mi_segment_ensure_committed(segment, _mi_segment_page_start_from_slice(segment, slice, 0, NULL), slice_count * MI_SEGMENT_SLICE_SIZE)) {
    return NULL;  // commit failed!
  }

  // convert the slices to a page
  slice->slice_offset = 0;
  slice->slice_count = (uint32_t)slice_count;
  mi_assert_internal(slice->slice_count == slice_count);
  const size_t bsize = slice_count * MI_SEGMENT_SLICE_SIZE;
  slice->block_size = bsize;
  mi_page_t*  page = mi_slice_to_page(slice);
  mi_assert_internal(mi_page_block_size(page) == bsize);

  // set slice back pointers for the first MI_MAX_SLICE_OFFSET_COUNT entries
  size_t extra = slice_count-1;
  if (extra > MI_MAX_SLICE_OFFSET_COUNT) extra = MI_MAX_SLICE_OFFSET_COUNT;
  if (slice_index + extra >= segment->slice_entries) extra = segment->slice_entries - slice_index - 1;  // huge objects may have more slices than avaiable entries in the segment->slices

  mi_slice_t* slice_next = slice + 1;
  for (size_t i = 1; i <= extra; i++, slice_next++) {
    slice_next->slice_offset = (uint32_t)(sizeof(mi_slice_t)*i);
    slice_next->slice_count = 0;
    slice_next->block_size = 1;
  }

  // and also for the last one (if not set already) (the last one is needed for coalescing and for large alignments)
  // note: the cast is needed for ubsan since the index can be larger than MI_SLICES_PER_SEGMENT for huge allocations (see #543)
  mi_slice_t* last = slice + slice_count - 1;
  mi_slice_t* end = (mi_slice_t*)mi_segment_slices_end(segment);
  if (last > end) last = end;
  if (last > slice) {
    last->slice_offset = (uint32_t)(sizeof(mi_slice_t) * (last - slice));
    last->slice_count = 0;
    last->block_size = 1;
  }

  // and initialize the page
  page->is_committed = true;
  page->is_huge = (segment->kind == MI_SEGMENT_HUGE);
  segment->used++;
  return page;
}